

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gostsum.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FILE *f;
  uint uVar5;
  int iVar6;
  char *__s;
  gost_subst_block *subst_block;
  ulong uVar7;
  long lVar8;
  int iVar9;
  gost_hash_ctx ctx;
  char inhash [65];
  char calcsum [65];
  char filename [4096];
  uint local_1164;
  uint local_1160;
  gost_hash_ctx local_1150;
  char local_10d8 [80];
  char local_1088 [80];
  char local_1038 [4104];
  
  bVar2 = true;
  bVar1 = 0;
  subst_block = &GostR3411_94_CryptoProParamSet;
  f = (FILE *)0x0;
  do {
    while( true ) {
      do {
        iVar3 = getopt(argc,argv,"bc::tv");
      } while (iVar3 == 0x62);
      if (iVar3 < 0x74) break;
      if (iVar3 == 0x76) {
        bVar1 = 1;
        bVar2 = false;
      }
      else {
        subst_block = &GostR3411_94_TestParamSet;
        if (iVar3 != 0x74) {
LAB_00101409:
          fprintf(_stderr,"invalid option %c",(ulong)_optopt);
          fwrite("gostsum [-bvt] [-c [file]]| [files]\n\t-c check message digests (default is generate)\n\t-v verbose, print file names when checking\n\t-b read files in binary mode\n\t-t use test GOST paramset (default is CryptoPro paramset)\nThe input for -c should be the list of message digests and file names\nthat is printed on stdout by this program when it generates digests.\n"
                 ,0x164,1,_stderr);
          exit(3);
        }
      }
    }
    if (iVar3 != 99) {
      if (iVar3 != -1) goto LAB_00101409;
      init_gost_hash_ctx(&local_1150,subst_block);
      iVar3 = _optind;
      if (f == (FILE *)0x0) {
        if (argc != _optind) {
          uVar5 = 0;
          if (_optind < argc) {
            iVar9 = argc - _optind;
            lVar8 = 0;
            iVar6 = 0;
            do {
              iVar4 = hash_file(&local_1150,argv[iVar3 + lVar8],local_1038,0);
              if (iVar4 == 0) {
                iVar6 = iVar6 + 1;
              }
              else {
                printf("%s %s\n",local_1038,argv[iVar3 + lVar8]);
              }
              lVar8 = lVar8 + 1;
            } while (iVar9 != (int)lVar8);
            uVar5 = (uint)(iVar6 != 0);
          }
          exit(uVar5);
        }
        iVar3 = fileno(_stdin);
        iVar3 = hash_stream(&local_1150,iVar3,local_1038);
        if (iVar3 != 0) {
          printf("%s -\n",local_1038);
          exit(0);
        }
        perror("stdin");
        exit(1);
      }
      if (((f != _stdin) || (argc <= _optind)) || (f = fopen(argv[_optind],"r"), f != (FILE *)0x0))
      {
        iVar3 = get_line((FILE *)f,local_10d8,local_1038);
        local_1164 = 0;
        local_1160 = 0;
        uVar7 = 0;
        if (iVar3 != 0) {
          uVar7 = 0;
          local_1160 = 0;
          local_1164 = 0;
          do {
            uVar5 = (uint)uVar7;
            while( true ) {
              uVar5 = uVar5 + 1;
              uVar7 = (ulong)uVar5;
              iVar3 = hash_file(&local_1150,local_1038,local_1088,0);
              if (iVar3 == 0) break;
              iVar3 = strncmp(local_1088,local_10d8,0x41);
              if (iVar3 == 0) {
                if (!bVar2) {
                  fprintf(_stderr,"%s\tOK\n",local_1038);
                }
              }
              else {
                if (bVar2) {
                  fprintf(_stderr,"%s: GOST hash sum check failed for \'%s\'\n",*argv,local_1038);
                }
                else {
                  fprintf(_stderr,"%s\tFAILED\n",local_1038);
                }
                local_1160 = local_1160 + 1;
              }
              iVar3 = get_line((FILE *)f,local_10d8,local_1038);
              if (iVar3 == 0) goto LAB_001014c4;
            }
            local_1164 = local_1164 + 1;
            iVar3 = get_line((FILE *)f,local_10d8,local_1038);
          } while (iVar3 != 0);
        }
LAB_001014c4:
        if (local_1164 != 0) {
          fprintf(_stderr,"%s: WARNING %d of %d file(s) cannot be processed\n",*argv,
                  (ulong)local_1164,uVar7);
        }
        if ((bool)(bVar1 & local_1160 != 0)) {
          fprintf(_stderr,"%s: %d of %d file(f) failed GOST hash sum check\n",*argv,
                  (ulong)local_1160,uVar7);
        }
        exit((uint)(local_1160 != 0 || local_1164 != 0));
      }
      __s = argv[_optind];
      goto LAB_001016bd;
    }
    f = _stdin;
    if ((_optarg != (char *)0x0) && (f = fopen(_optarg,"r"), __s = _optarg, f == (FILE *)0x0)) {
LAB_001016bd:
      perror(__s);
      exit(2);
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    int c, i;
    int verbose = 0;
    int errors = 0;
    int open_mode = O_RDONLY;
    gost_subst_block *b = &GostR3411_94_CryptoProParamSet;
    FILE *check_file = NULL;
    gost_hash_ctx ctx;

    while ((c = getopt(argc, argv, "bc::tv")) != -1) {
        switch (c) {
        case 'v':
            verbose = 1;
            break;
        case 't':
            b = &GostR3411_94_TestParamSet;
            break;
        case 'b':
            open_mode |= O_BINARY;
            break;
        case 'c':
            if (optarg) {
                check_file = fopen(optarg, "r");
                if (!check_file) {
                    perror(optarg);
                    exit(2);
                }
            } else {
                check_file = stdin;
            }
            break;
        default:
            fprintf(stderr, "invalid option %c", optopt);
            help();
        }
    }
    init_gost_hash_ctx(&ctx, b);
    if (check_file) {
        char inhash[65], calcsum[65], filename[PATH_MAX];
        int failcount = 0, count = 0;
        errors = 0;
        if (check_file == stdin && optind < argc) {
            check_file = fopen(argv[optind], "r");
            if (!check_file) {
                perror(argv[optind]);
                exit(2);
            }
        }
        while (get_line(check_file, inhash, filename)) {
            count++;
            if (!hash_file(&ctx, filename, calcsum, open_mode)) {
                errors++;
                continue;
            }
            if (strncmp(calcsum, inhash, 65) == 0) {
                if (verbose) {
                    fprintf(stderr, "%s\tOK\n", filename);
                }
            } else {
                if (verbose) {
                    fprintf(stderr, "%s\tFAILED\n", filename);
                } else {
                    fprintf(stderr,
                            "%s: GOST hash sum check failed for '%s'\n",
                            argv[0], filename);
                }
                failcount++;
            }
        }
        if (errors) {
            fprintf(stderr,
                    "%s: WARNING %d of %d file(s) cannot be processed\n",
                    argv[0], errors, count);

        }
        if (verbose && failcount) {
            fprintf(stderr,
                    "%s: %d of %d file(f) failed GOST hash sum check\n",
                    argv[0], failcount, count);
        }
        exit((failcount || errors) ? 1 : 0);
    }
    if (optind == argc) {
        char sum[65];
#ifdef _WIN32
        if (open_mode & O_BINARY) {
            _setmode(fileno(stdin), O_BINARY);
        }
#endif
        if (!hash_stream(&ctx, fileno(stdin), sum)) {
            perror("stdin");
            exit(1);
        }
        printf("%s -\n", sum);
        exit(0);
    }
    for (i = optind; i < argc; i++) {
        char sum[65];
        if (!hash_file(&ctx, argv[i], sum, open_mode)) {
            errors++;
        } else {
            printf("%s %s\n", sum, argv[i]);
        }
    }
    exit(errors ? 1 : 0);
}